

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

Udata * luaS_newudata(lua_State *L,size_t s,unsigned_short nuvalue)

{
  Udata *pUVar1;
  ulong uVar2;
  int iVar3;
  undefined6 in_register_00000012;
  ulong uVar4;
  
  iVar3 = (int)CONCAT62(in_register_00000012,nuvalue);
  uVar4 = (ulong)(uint)(iVar3 << 4);
  uVar2 = 0x20;
  if (iVar3 != 0) {
    uVar2 = uVar4 + 0x28;
  }
  if (s <= (uVar2 ^ 0x7fffffffffffffff)) {
    pUVar1 = (Udata *)luaC_newobj(L,'\a',uVar2 + s);
    pUVar1->len = s;
    pUVar1->nuvalue = nuvalue;
    pUVar1->metatable = (Table *)0x0;
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 0x10) {
      *(undefined1 *)((long)pUVar1->uv + uVar2 + 8) = 0;
    }
    return pUVar1;
  }
  luaM_toobig(L);
}

Assistant:

Udata *luaS_newudata (lua_State *L, size_t s, unsigned short nuvalue) {
  Udata *u;
  int i;
  GCObject *o;
  if (l_unlikely(s > MAX_SIZE - udatamemoffset(nuvalue)))
    luaM_toobig(L);
  o = luaC_newobj(L, LUA_VUSERDATA, sizeudata(nuvalue, s));
  u = gco2u(o);
  u->len = s;
  u->nuvalue = nuvalue;
  u->metatable = NULL;
  for (i = 0; i < nuvalue; i++)
    setnilvalue(&u->uv[i].uv);
  return u;
}